

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_NotNull_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_NotNull_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, NotNull)
{
    if( void* p = this )
        ASSERT_NOTNULL(p) << p;
    if( void* p = this )
        EXPECT_NOTNULL(p) << p;
    if( void* p = this )
        INFORM_NOTNULL(p) << p;
    if( void* p = this )
        ASSUME_NOTNULL(p) << p;
}